

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::
MicroStringPrevTest_SetInChunksKeepsSizeValidEvenIfWeDontWriteAll_Test::
~MicroStringPrevTest_SetInChunksKeepsSizeValidEvenIfWeDontWriteAll_Test
          (MicroStringPrevTest_SetInChunksKeepsSizeValidEvenIfWeDontWriteAll_Test *this)

{
  MicroStringPrevTest::~MicroStringPrevTest(&this->super_MicroStringPrevTest);
  operator_delete(this,200);
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetInChunksKeepsSizeValidEvenIfWeDontWriteAll) {
  // Here we say 5 bytes, but only append 4.
  // The final size should still be 4.
  str_.SetInChunks(5, arena(), [](auto append) {
    append("C");
    append("H");
    append("N");
    append("K");
  });
  EXPECT_EQ(str_.Get(), "CHNK");
}